

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType2::GridDataType2
          (GridDataType2 *this,KUINT16 SampleType,vector<float,_std::allocator<float>_> *Values)

{
  size_type sVar1;
  vector<float,_std::allocator<float>_> *Values_local;
  KUINT16 SampleType_local;
  GridDataType2 *this_local;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType2_0032e890;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(Values);
  *(short *)&(this->super_GridData).field_0xc = (short)sVar1;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_vf32Values,Values);
  this->m_ui16Padding = 0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = 2;
  return;
}

Assistant:

GridDataType2::GridDataType2( KUINT16 SampleType, const std::vector<KFLOAT32> & Values ) :
    m_ui16NumValues( Values.size() ),
    m_vf32Values( Values ),
    m_ui16Padding( 0 )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = Type2;
}